

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bitvec.cpp
# Opt level: O1

void rrot8(void *blob,int len,int c)

{
  undefined1 uVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  byte bVar21;
  ulong uVar22;
  int iVar23;
  int nbytes;
  uint8_t *k;
  uint uVar24;
  ulong uVar25;
  ushort uVar26;
  ulong uVar27;
  ulong uVar28;
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar44 [64];
  undefined1 auVar43 [64];
  
  if (c != 0) {
    iVar23 = c + 7;
    if (-1 < c) {
      iVar23 = c;
    }
    if (7 < c) {
      iVar23 = iVar23 >> 3;
      do {
        uVar1 = *blob;
        if (1 < len) {
          memmove(blob,(void *)((long)blob + 1),(ulong)(len - 1U));
        }
        *(undefined1 *)((long)blob + (long)(int)(len - 1U)) = uVar1;
        iVar23 = iVar23 + -1;
      } while (iVar23 != 0);
    }
    if (((c & 7U) != 0) && (0 < len)) {
      auVar29 = vpbroadcastq_avx512f();
      auVar30 = vpbroadcastq_avx512f();
      auVar31 = vpbroadcastb_avx512bw(ZEXT116(*blob));
      auVar32 = vpmovsxbq_avx512f(ZEXT816(0x3f3e3d3c3b3a3938));
      auVar33 = vpmovsxbq_avx512f(ZEXT816(0x3736353433323130));
      auVar34 = vpmovsxbq_avx512f(ZEXT816(0x2f2e2d2c2b2a2928));
      auVar35 = vpmovsxbq_avx512f(ZEXT816(0x2726252423222120));
      auVar36 = vpmovsxbq_avx512f(ZEXT816(0x1f1e1d1c1b1a1918));
      auVar37 = vpmovsxbq_avx512f(ZEXT816(0x1716151413121110));
      auVar38 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
      auVar39 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
      uVar22 = 0;
      auVar5 = vpand_avx(ZEXT416((uint)c),_DAT_001a4300);
      auVar40 = vmovdqa64_avx512f(_DAT_001a4240);
      auVar41 = vpbroadcastq_avx512f(ZEXT816(0x40));
      do {
        uVar13 = vpcmpuq_avx512f(auVar39,auVar29,2);
        uVar14 = vpcmpuq_avx512f(auVar38,auVar29,2);
        uVar15 = vpcmpuq_avx512f(auVar37,auVar29,2);
        uVar16 = vpcmpuq_avx512f(auVar36,auVar29,2);
        uVar17 = vpcmpuq_avx512f(auVar35,auVar29,2);
        uVar18 = vpcmpuq_avx512f(auVar34,auVar29,2);
        uVar19 = vpcmpuq_avx512f(auVar33,auVar29,2);
        uVar20 = vpcmpuq_avx512f(auVar32,auVar29,2);
        bVar21 = (byte)uVar20;
        uVar26 = CONCAT11(bVar21,(byte)uVar19);
        uVar24 = CONCAT22(uVar26,CONCAT11((byte)uVar18,(byte)uVar17));
        uVar25 = CONCAT44(uVar24,CONCAT22(CONCAT11((byte)uVar16,(byte)uVar15),
                                          CONCAT11((byte)uVar14,(byte)uVar13)));
        uVar20 = vpcmpeqq_avx512f(auVar39,auVar30);
        uVar6 = vpcmpeqq_avx512f(auVar38,auVar30);
        uVar7 = vpcmpeqq_avx512f(auVar37,auVar30);
        uVar8 = vpcmpeqq_avx512f(auVar36,auVar30);
        uVar9 = vpcmpeqq_avx512f(auVar35,auVar30);
        uVar10 = vpcmpeqq_avx512f(auVar34,auVar30);
        uVar11 = vpcmpeqq_avx512f(auVar33,auVar30);
        uVar12 = vpcmpeqq_avx512f(auVar32,auVar30);
        uVar28 = CONCAT44(CONCAT22(CONCAT11((char)uVar12,(char)uVar11),
                                   CONCAT11((char)uVar10,(char)uVar9)),
                          CONCAT22(CONCAT11((char)uVar8,(char)uVar7),
                                   CONCAT11((char)uVar6,(char)uVar20)));
        uVar27 = ~uVar28 & uVar25;
        auVar42 = vmovdqu8_avx512bw(*(undefined1 (*) [64])((long)blob + uVar22 + 1));
        bVar3 = (byte)(uVar27 >> 0x38);
        uVar28 = uVar25 & uVar28;
        auVar43 = vmovdqu8_avx512bw(auVar31);
        bVar2 = (bool)((byte)uVar28 & 1);
        auVar44[0] = bVar2 * auVar43[0] | !bVar2 * ((byte)uVar27 & 1) * auVar42[0];
        bVar2 = (bool)((byte)(uVar28 >> 1) & 1);
        auVar44[1] = bVar2 * auVar43[1] | !bVar2 * ((byte)(uVar27 >> 1) & 1) * auVar42[1];
        bVar2 = (bool)((byte)(uVar28 >> 2) & 1);
        auVar44[2] = bVar2 * auVar43[2] | !bVar2 * ((byte)(uVar27 >> 2) & 1) * auVar42[2];
        bVar2 = (bool)((byte)(uVar28 >> 3) & 1);
        auVar44[3] = bVar2 * auVar43[3] | !bVar2 * ((byte)(uVar27 >> 3) & 1) * auVar42[3];
        bVar2 = (bool)((byte)(uVar28 >> 4) & 1);
        auVar44[4] = bVar2 * auVar43[4] | !bVar2 * ((byte)(uVar27 >> 4) & 1) * auVar42[4];
        bVar2 = (bool)((byte)(uVar28 >> 5) & 1);
        auVar44[5] = bVar2 * auVar43[5] | !bVar2 * ((byte)(uVar27 >> 5) & 1) * auVar42[5];
        bVar2 = (bool)((byte)(uVar28 >> 6) & 1);
        auVar44[6] = bVar2 * auVar43[6] | !bVar2 * ((byte)(uVar27 >> 6) & 1) * auVar42[6];
        bVar2 = (bool)((byte)(uVar28 >> 7) & 1);
        auVar44[7] = bVar2 * auVar43[7] | !bVar2 * ((byte)(uVar27 >> 7) & 1) * auVar42[7];
        bVar2 = (bool)((byte)(uVar28 >> 8) & 1);
        auVar44[8] = bVar2 * auVar43[8] | !bVar2 * ((byte)(uVar27 >> 8) & 1) * auVar42[8];
        bVar2 = (bool)((byte)(uVar28 >> 9) & 1);
        auVar44[9] = bVar2 * auVar43[9] | !bVar2 * ((byte)(uVar27 >> 9) & 1) * auVar42[9];
        bVar2 = (bool)((byte)(uVar28 >> 10) & 1);
        auVar44[10] = bVar2 * auVar43[10] | !bVar2 * ((byte)(uVar27 >> 10) & 1) * auVar42[10];
        bVar2 = (bool)((byte)(uVar28 >> 0xb) & 1);
        auVar44[0xb] = bVar2 * auVar43[0xb] | !bVar2 * ((byte)(uVar27 >> 0xb) & 1) * auVar42[0xb];
        bVar2 = (bool)((byte)(uVar28 >> 0xc) & 1);
        auVar44[0xc] = bVar2 * auVar43[0xc] | !bVar2 * ((byte)(uVar27 >> 0xc) & 1) * auVar42[0xc];
        bVar2 = (bool)((byte)(uVar28 >> 0xd) & 1);
        auVar44[0xd] = bVar2 * auVar43[0xd] | !bVar2 * ((byte)(uVar27 >> 0xd) & 1) * auVar42[0xd];
        bVar2 = (bool)((byte)(uVar28 >> 0xe) & 1);
        auVar44[0xe] = bVar2 * auVar43[0xe] | !bVar2 * ((byte)(uVar27 >> 0xe) & 1) * auVar42[0xe];
        bVar2 = (bool)((byte)(uVar28 >> 0xf) & 1);
        auVar44[0xf] = bVar2 * auVar43[0xf] | !bVar2 * ((byte)(uVar27 >> 0xf) & 1) * auVar42[0xf];
        bVar2 = (bool)((byte)(uVar28 >> 0x10) & 1);
        auVar44[0x10] =
             bVar2 * auVar43[0x10] | !bVar2 * ((byte)(uVar27 >> 0x10) & 1) * auVar42[0x10];
        bVar2 = (bool)((byte)(uVar28 >> 0x11) & 1);
        auVar44[0x11] =
             bVar2 * auVar43[0x11] | !bVar2 * ((byte)(uVar27 >> 0x11) & 1) * auVar42[0x11];
        bVar2 = (bool)((byte)(uVar28 >> 0x12) & 1);
        auVar44[0x12] =
             bVar2 * auVar43[0x12] | !bVar2 * ((byte)(uVar27 >> 0x12) & 1) * auVar42[0x12];
        bVar2 = (bool)((byte)(uVar28 >> 0x13) & 1);
        auVar44[0x13] =
             bVar2 * auVar43[0x13] | !bVar2 * ((byte)(uVar27 >> 0x13) & 1) * auVar42[0x13];
        bVar2 = (bool)((byte)(uVar28 >> 0x14) & 1);
        auVar44[0x14] =
             bVar2 * auVar43[0x14] | !bVar2 * ((byte)(uVar27 >> 0x14) & 1) * auVar42[0x14];
        bVar2 = (bool)((byte)(uVar28 >> 0x15) & 1);
        auVar44[0x15] =
             bVar2 * auVar43[0x15] | !bVar2 * ((byte)(uVar27 >> 0x15) & 1) * auVar42[0x15];
        bVar2 = (bool)((byte)(uVar28 >> 0x16) & 1);
        auVar44[0x16] =
             bVar2 * auVar43[0x16] | !bVar2 * ((byte)(uVar27 >> 0x16) & 1) * auVar42[0x16];
        bVar2 = (bool)((byte)(uVar28 >> 0x17) & 1);
        auVar44[0x17] =
             bVar2 * auVar43[0x17] | !bVar2 * ((byte)(uVar27 >> 0x17) & 1) * auVar42[0x17];
        bVar2 = (bool)((byte)(uVar28 >> 0x18) & 1);
        auVar44[0x18] =
             bVar2 * auVar43[0x18] | !bVar2 * ((byte)(uVar27 >> 0x18) & 1) * auVar42[0x18];
        bVar2 = (bool)((byte)(uVar28 >> 0x19) & 1);
        auVar44[0x19] =
             bVar2 * auVar43[0x19] | !bVar2 * ((byte)(uVar27 >> 0x19) & 1) * auVar42[0x19];
        bVar2 = (bool)((byte)(uVar28 >> 0x1a) & 1);
        auVar44[0x1a] =
             bVar2 * auVar43[0x1a] | !bVar2 * ((byte)(uVar27 >> 0x1a) & 1) * auVar42[0x1a];
        bVar2 = (bool)((byte)(uVar28 >> 0x1b) & 1);
        auVar44[0x1b] =
             bVar2 * auVar43[0x1b] | !bVar2 * ((byte)(uVar27 >> 0x1b) & 1) * auVar42[0x1b];
        bVar2 = (bool)((byte)(uVar28 >> 0x1c) & 1);
        auVar44[0x1c] =
             bVar2 * auVar43[0x1c] | !bVar2 * ((byte)(uVar27 >> 0x1c) & 1) * auVar42[0x1c];
        bVar2 = (bool)((byte)(uVar28 >> 0x1d) & 1);
        auVar44[0x1d] =
             bVar2 * auVar43[0x1d] | !bVar2 * ((byte)(uVar27 >> 0x1d) & 1) * auVar42[0x1d];
        bVar2 = (bool)((byte)(uVar28 >> 0x1e) & 1);
        auVar44[0x1e] =
             bVar2 * auVar43[0x1e] | !bVar2 * ((byte)(uVar27 >> 0x1e) & 1) * auVar42[0x1e];
        bVar2 = (bool)((byte)(uVar28 >> 0x1f) & 1);
        auVar44[0x1f] =
             bVar2 * auVar43[0x1f] | !bVar2 * ((byte)(uVar27 >> 0x1f) & 1) * auVar42[0x1f];
        bVar2 = (bool)((byte)(uVar28 >> 0x20) & 1);
        auVar44[0x20] =
             bVar2 * auVar43[0x20] | !bVar2 * ((byte)(uVar27 >> 0x20) & 1) * auVar42[0x20];
        bVar2 = (bool)((byte)(uVar28 >> 0x21) & 1);
        auVar44[0x21] =
             bVar2 * auVar43[0x21] | !bVar2 * ((byte)(uVar27 >> 0x21) & 1) * auVar42[0x21];
        bVar2 = (bool)((byte)(uVar28 >> 0x22) & 1);
        auVar44[0x22] =
             bVar2 * auVar43[0x22] | !bVar2 * ((byte)(uVar27 >> 0x22) & 1) * auVar42[0x22];
        bVar2 = (bool)((byte)(uVar28 >> 0x23) & 1);
        auVar44[0x23] =
             bVar2 * auVar43[0x23] | !bVar2 * ((byte)(uVar27 >> 0x23) & 1) * auVar42[0x23];
        bVar2 = (bool)((byte)(uVar28 >> 0x24) & 1);
        auVar44[0x24] =
             bVar2 * auVar43[0x24] | !bVar2 * ((byte)(uVar27 >> 0x24) & 1) * auVar42[0x24];
        bVar2 = (bool)((byte)(uVar28 >> 0x25) & 1);
        auVar44[0x25] =
             bVar2 * auVar43[0x25] | !bVar2 * ((byte)(uVar27 >> 0x25) & 1) * auVar42[0x25];
        bVar2 = (bool)((byte)(uVar28 >> 0x26) & 1);
        auVar44[0x26] =
             bVar2 * auVar43[0x26] | !bVar2 * ((byte)(uVar27 >> 0x26) & 1) * auVar42[0x26];
        bVar2 = (bool)((byte)(uVar28 >> 0x27) & 1);
        auVar44[0x27] =
             bVar2 * auVar43[0x27] | !bVar2 * ((byte)(uVar27 >> 0x27) & 1) * auVar42[0x27];
        bVar2 = (bool)((byte)(uVar28 >> 0x28) & 1);
        auVar44[0x28] =
             bVar2 * auVar43[0x28] | !bVar2 * ((byte)(uVar27 >> 0x28) & 1) * auVar42[0x28];
        bVar2 = (bool)((byte)(uVar28 >> 0x29) & 1);
        auVar44[0x29] =
             bVar2 * auVar43[0x29] | !bVar2 * ((byte)(uVar27 >> 0x29) & 1) * auVar42[0x29];
        bVar2 = (bool)((byte)(uVar28 >> 0x2a) & 1);
        auVar44[0x2a] =
             bVar2 * auVar43[0x2a] | !bVar2 * ((byte)(uVar27 >> 0x2a) & 1) * auVar42[0x2a];
        bVar2 = (bool)((byte)(uVar28 >> 0x2b) & 1);
        auVar44[0x2b] =
             bVar2 * auVar43[0x2b] | !bVar2 * ((byte)(uVar27 >> 0x2b) & 1) * auVar42[0x2b];
        bVar2 = (bool)((byte)(uVar28 >> 0x2c) & 1);
        auVar44[0x2c] =
             bVar2 * auVar43[0x2c] | !bVar2 * ((byte)(uVar27 >> 0x2c) & 1) * auVar42[0x2c];
        bVar2 = (bool)((byte)(uVar28 >> 0x2d) & 1);
        auVar44[0x2d] =
             bVar2 * auVar43[0x2d] | !bVar2 * ((byte)(uVar27 >> 0x2d) & 1) * auVar42[0x2d];
        bVar2 = (bool)((byte)(uVar28 >> 0x2e) & 1);
        auVar44[0x2e] =
             bVar2 * auVar43[0x2e] | !bVar2 * ((byte)(uVar27 >> 0x2e) & 1) * auVar42[0x2e];
        bVar2 = (bool)((byte)(uVar28 >> 0x2f) & 1);
        auVar44[0x2f] =
             bVar2 * auVar43[0x2f] | !bVar2 * ((byte)(uVar27 >> 0x2f) & 1) * auVar42[0x2f];
        bVar2 = (bool)((byte)(uVar28 >> 0x30) & 1);
        auVar44[0x30] =
             bVar2 * auVar43[0x30] | !bVar2 * ((byte)(uVar27 >> 0x30) & 1) * auVar42[0x30];
        bVar2 = (bool)((byte)(uVar28 >> 0x31) & 1);
        auVar44[0x31] =
             bVar2 * auVar43[0x31] | !bVar2 * ((byte)(uVar27 >> 0x31) & 1) * auVar42[0x31];
        bVar2 = (bool)((byte)(uVar28 >> 0x32) & 1);
        auVar44[0x32] =
             bVar2 * auVar43[0x32] | !bVar2 * ((byte)(uVar27 >> 0x32) & 1) * auVar42[0x32];
        bVar2 = (bool)((byte)(uVar28 >> 0x33) & 1);
        auVar44[0x33] =
             bVar2 * auVar43[0x33] | !bVar2 * ((byte)(uVar27 >> 0x33) & 1) * auVar42[0x33];
        bVar2 = (bool)((byte)(uVar28 >> 0x34) & 1);
        auVar44[0x34] =
             bVar2 * auVar43[0x34] | !bVar2 * ((byte)(uVar27 >> 0x34) & 1) * auVar42[0x34];
        bVar2 = (bool)((byte)(uVar28 >> 0x35) & 1);
        auVar44[0x35] =
             bVar2 * auVar43[0x35] | !bVar2 * ((byte)(uVar27 >> 0x35) & 1) * auVar42[0x35];
        bVar2 = (bool)((byte)(uVar28 >> 0x36) & 1);
        auVar44[0x36] =
             bVar2 * auVar43[0x36] | !bVar2 * ((byte)(uVar27 >> 0x36) & 1) * auVar42[0x36];
        bVar2 = (bool)((byte)(uVar28 >> 0x37) & 1);
        auVar44[0x37] =
             bVar2 * auVar43[0x37] | !bVar2 * ((byte)(uVar27 >> 0x37) & 1) * auVar42[0x37];
        bVar4 = (byte)(uVar28 >> 0x38);
        auVar44[0x38] =
             (bVar4 & 1) * auVar43[0x38] | !(bool)(bVar4 & 1) * (bVar3 & 1) * auVar42[0x38];
        bVar2 = (bool)(bVar4 >> 1 & 1);
        auVar44[0x39] = bVar2 * auVar43[0x39] | !bVar2 * (bVar3 >> 1 & 1) * auVar42[0x39];
        bVar2 = (bool)(bVar4 >> 2 & 1);
        auVar44[0x3a] = bVar2 * auVar43[0x3a] | !bVar2 * (bVar3 >> 2 & 1) * auVar42[0x3a];
        bVar2 = (bool)(bVar4 >> 3 & 1);
        auVar44[0x3b] = bVar2 * auVar43[0x3b] | !bVar2 * (bVar3 >> 3 & 1) * auVar42[0x3b];
        bVar2 = (bool)(bVar4 >> 4 & 1);
        auVar44[0x3c] = bVar2 * auVar43[0x3c] | !bVar2 * (bVar3 >> 4 & 1) * auVar42[0x3c];
        bVar2 = (bool)(bVar4 >> 5 & 1);
        auVar44[0x3d] = bVar2 * auVar43[0x3d] | !bVar2 * (bVar3 >> 5 & 1) * auVar42[0x3d];
        bVar2 = (bool)(bVar4 >> 6 & 1);
        auVar44[0x3e] = bVar2 * auVar43[0x3e] | !bVar2 * (bVar3 >> 6 & 1) * auVar42[0x3e];
        auVar44[0x3f] =
             -((char)bVar4 >> 7) * auVar43[0x3f] |
             !(bool)-((char)bVar4 >> 7) * -((char)bVar3 >> 7) * auVar42[0x3f];
        auVar42 = vmovdqu8_avx512bw(*(undefined1 (*) [64])((long)blob + uVar22));
        auVar43[1] = ((byte)(uVar25 >> 1) & 1) * auVar42[1];
        auVar43[0] = ((byte)uVar13 & 1) * auVar42[0];
        auVar43[2] = ((byte)(uVar25 >> 2) & 1) * auVar42[2];
        auVar43[3] = ((byte)(uVar25 >> 3) & 1) * auVar42[3];
        auVar43[4] = ((byte)(uVar25 >> 4) & 1) * auVar42[4];
        auVar43[5] = ((byte)(uVar25 >> 5) & 1) * auVar42[5];
        auVar43[6] = ((byte)(uVar25 >> 6) & 1) * auVar42[6];
        auVar43[7] = ((byte)(uVar25 >> 7) & 1) * auVar42[7];
        auVar43[8] = ((byte)uVar14 & 1) * auVar42[8];
        auVar43[9] = ((byte)(uVar25 >> 9) & 1) * auVar42[9];
        auVar43[10] = ((byte)(uVar25 >> 10) & 1) * auVar42[10];
        auVar43[0xb] = ((byte)(uVar25 >> 0xb) & 1) * auVar42[0xb];
        auVar43[0xc] = ((byte)(uVar25 >> 0xc) & 1) * auVar42[0xc];
        auVar43[0xd] = ((byte)(uVar25 >> 0xd) & 1) * auVar42[0xd];
        auVar43[0xe] = ((byte)(uVar25 >> 0xe) & 1) * auVar42[0xe];
        auVar43[0xf] = ((byte)(uVar25 >> 0xf) & 1) * auVar42[0xf];
        auVar43[0x10] = ((byte)uVar15 & 1) * auVar42[0x10];
        auVar43[0x11] = ((byte)(uVar25 >> 0x11) & 1) * auVar42[0x11];
        auVar43[0x12] = ((byte)(uVar25 >> 0x12) & 1) * auVar42[0x12];
        auVar43[0x13] = ((byte)(uVar25 >> 0x13) & 1) * auVar42[0x13];
        auVar43[0x14] = ((byte)(uVar25 >> 0x14) & 1) * auVar42[0x14];
        auVar43[0x15] = ((byte)(uVar25 >> 0x15) & 1) * auVar42[0x15];
        auVar43[0x16] = ((byte)(uVar25 >> 0x16) & 1) * auVar42[0x16];
        auVar43[0x17] = ((byte)(uVar25 >> 0x17) & 1) * auVar42[0x17];
        auVar43[0x18] = ((byte)uVar16 & 1) * auVar42[0x18];
        auVar43[0x19] = ((byte)(uVar25 >> 0x19) & 1) * auVar42[0x19];
        auVar43[0x1a] = ((byte)(uVar25 >> 0x1a) & 1) * auVar42[0x1a];
        auVar43[0x1b] = ((byte)(uVar25 >> 0x1b) & 1) * auVar42[0x1b];
        auVar43[0x1c] = ((byte)(uVar25 >> 0x1c) & 1) * auVar42[0x1c];
        auVar43[0x1d] = ((byte)(uVar25 >> 0x1d) & 1) * auVar42[0x1d];
        auVar43[0x1e] = ((byte)(uVar25 >> 0x1e) & 1) * auVar42[0x1e];
        auVar43[0x1f] = ((byte)(uVar25 >> 0x1f) & 1) * auVar42[0x1f];
        auVar43[0x20] = ((byte)uVar17 & 1) * auVar42[0x20];
        auVar43[0x21] = ((byte)(uVar24 >> 1) & 1) * auVar42[0x21];
        auVar43[0x22] = ((byte)(uVar24 >> 2) & 1) * auVar42[0x22];
        auVar43[0x23] = ((byte)(uVar24 >> 3) & 1) * auVar42[0x23];
        auVar43[0x24] = ((byte)(uVar24 >> 4) & 1) * auVar42[0x24];
        auVar43[0x25] = ((byte)(uVar24 >> 5) & 1) * auVar42[0x25];
        auVar43[0x26] = ((byte)(uVar24 >> 6) & 1) * auVar42[0x26];
        auVar43[0x27] = ((byte)(uVar24 >> 7) & 1) * auVar42[0x27];
        auVar43[0x28] = ((byte)uVar18 & 1) * auVar42[0x28];
        auVar43[0x29] = ((byte)(uVar24 >> 9) & 1) * auVar42[0x29];
        auVar43[0x2a] = ((byte)(uVar24 >> 10) & 1) * auVar42[0x2a];
        auVar43[0x2b] = ((byte)(uVar24 >> 0xb) & 1) * auVar42[0x2b];
        auVar43[0x2c] = ((byte)(uVar24 >> 0xc) & 1) * auVar42[0x2c];
        auVar43[0x2d] = ((byte)(uVar24 >> 0xd) & 1) * auVar42[0x2d];
        auVar43[0x2e] = ((byte)(uVar24 >> 0xe) & 1) * auVar42[0x2e];
        auVar43[0x2f] = ((byte)(uVar24 >> 0xf) & 1) * auVar42[0x2f];
        auVar43[0x30] = ((byte)uVar19 & 1) * auVar42[0x30];
        auVar43[0x31] = ((byte)(uVar26 >> 1) & 1) * auVar42[0x31];
        auVar43[0x32] = ((byte)(uVar26 >> 2) & 1) * auVar42[0x32];
        auVar43[0x33] = ((byte)(uVar26 >> 3) & 1) * auVar42[0x33];
        auVar43[0x34] = ((byte)(uVar26 >> 4) & 1) * auVar42[0x34];
        auVar43[0x35] = ((byte)(uVar26 >> 5) & 1) * auVar42[0x35];
        auVar43[0x36] = ((byte)(uVar26 >> 6) & 1) * auVar42[0x36];
        auVar43[0x37] = ((byte)(uVar26 >> 7) & 1) * auVar42[0x37];
        auVar43[0x38] = (bVar21 & 1) * auVar42[0x38];
        auVar43[0x39] = (bVar21 >> 1 & 1) * auVar42[0x39];
        auVar43[0x3a] = (bVar21 >> 2 & 1) * auVar42[0x3a];
        auVar43[0x3b] = (bVar21 >> 3 & 1) * auVar42[0x3b];
        auVar43[0x3c] = (bVar21 >> 4 & 1) * auVar42[0x3c];
        auVar43[0x3d] = (bVar21 >> 5 & 1) * auVar42[0x3d];
        auVar43[0x3e] = (bVar21 >> 6 & 1) * auVar42[0x3e];
        auVar43[0x3f] = -((char)bVar21 >> 7) * auVar42[0x3f];
        auVar42 = vpunpckhbw_avx512bw(auVar43,auVar44);
        auVar42 = vpsrlw_avx512bw(auVar42,auVar5);
        auVar43 = vpunpcklbw_avx512bw(auVar43,auVar44);
        auVar43 = vpsrlw_avx512bw(auVar43,auVar5);
        auVar42 = vpermt2b_avx512_vbmi(auVar43,auVar40,auVar42);
        auVar42 = vmovdqu8_avx512bw(auVar42);
        *(undefined1 (*) [64])((long)blob + uVar22) = auVar42;
        uVar22 = uVar22 + 0x40;
        auVar39 = vpaddq_avx512f(auVar39,auVar41);
        auVar38 = vpaddq_avx512f(auVar38,auVar41);
        auVar37 = vpaddq_avx512f(auVar37,auVar41);
        auVar36 = vpaddq_avx512f(auVar36,auVar41);
        auVar35 = vpaddq_avx512f(auVar35,auVar41);
        auVar34 = vpaddq_avx512f(auVar34,auVar41);
        auVar33 = vpaddq_avx512f(auVar33,auVar41);
        auVar32 = vpaddq_avx512f(auVar32,auVar41);
      } while ((len + 0x3fU & 0xffffffc0) != uVar22);
    }
  }
  return;
}

Assistant:

void rrot8 ( void * blob, int len, int c )
{
  int nbytes  = len;

  uint8_t * k = (uint8_t*)blob;

  if(c == 0) return;

  //----------

  int b = c / 8;
  c &= (8-1);

  for(int j = 0; j < b; j++)
  {
    uint8_t t = k[0];

    for(int i = 0; i < nbytes-1; i++)
    {
      k[i] = k[i+1];
    }

    k[nbytes-1] = t;
  }

  if(c == 0) return;

  //----------

  uint8_t t = k[0];

  for(int i = 0; i < nbytes; i++)
  {
    uint8_t a = (i == nbytes-1) ? t : k[i+1];
    uint8_t b = k[i];

    k[i] = (a << (8-c)) | (b >> c);
  }
}